

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_yplus_lengthscale2
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  REF_NODE ref_node;
  REF_NODE ref_node_00;
  REF_DBL *pRVar5;
  REF_CELL ref_cell;
  REF_INT leading_dim;
  REF_INT RVar6;
  REF_INT RVar7;
  uint uVar8;
  REF_STATUS RVar9;
  uint uVar10;
  ulong uVar11;
  void *__ptr;
  long lVar12;
  REF_DBL *pRVar13;
  long lVar14;
  undefined8 uVar15;
  char *pcVar16;
  REF_CELL pRVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  ulong uStackY_220;
  REF_INT new_node;
  REF_INT local_1fc;
  REF_CELL local_1f8;
  REF_CELL local_1f0;
  double local_1e8;
  double local_1e0;
  ulong local_1d8;
  REF_INT ntri;
  undefined4 uStack_1cc;
  REF_GLOB global;
  REF_GRID exchange_grid;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  
  if (ref_grid->twod == 0) {
    pcVar16 = "implement 3D";
    uVar8 = 6;
    uVar15 = 0x34c;
  }
  else {
    ref_node = ref_grid->node;
    uVar8 = ref_grid_create(&exchange_grid,ref_grid->mpi);
    if (uVar8 == 0) {
      ref_node_00 = exchange_grid->node;
      uVar8 = ref_node->max;
      uVar11 = 0;
      uVar18 = 0;
      if (0 < (int)uVar8) {
        uVar18 = (ulong)uVar8;
      }
      for (; uVar18 != uVar11; uVar11 = uVar11 + 1) {
        if (-1 < ref_node->global[uVar11]) {
          lengthscale[uVar11] = 0.0;
        }
      }
      if ((int)uVar8 < 0) {
        pcVar16 = "malloc hits of REF_INT negative";
        uVar15 = 0x352;
LAB_001ba9c1:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar15,"ref_phys_yplus_lengthscale2",pcVar16);
        return 1;
      }
      __ptr = malloc((ulong)uVar8 << 2);
      if (__ptr == (void *)0x0) {
        pcVar16 = "malloc hits of REF_INT NULL";
        uVar15 = 0x352;
LAB_001ba9f6:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar15,"ref_phys_yplus_lengthscale2",pcVar16);
        return 2;
      }
      for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined4 *)((long)__ptr + uVar11 * 4) = 0;
      }
      uVar8 = ref_node_initialize_n_global(ref_node_00,0);
      if (uVar8 == 0) {
        local_1f8 = ref_grid->cell[0];
        local_1f0 = ref_grid->cell[3];
        uVar11 = 0;
        local_1fc = ldim;
        for (uVar8 = 0; (int)uVar8 < local_1f8->max; uVar8 = uVar8 + 1) {
          RVar9 = ref_cell_nodes(local_1f8,uVar8,edg_nodes);
          if (RVar9 == 0) {
            local_1d8 = uVar11;
            uVar10 = ref_layer_interior_seg_normal(ref_grid,uVar8,edg_norm);
            if (uVar10 != 0) {
              pcVar16 = "edge norm";
              uVar15 = 0x361;
              goto LAB_001badda;
            }
            uVar10 = ref_cell_list_with2(ref_grid->cell[3],edg_nodes[0],edg_nodes[1],2,&ntri,
                                         tri_list);
            if (uVar10 != 0) {
              pcVar16 = "tri with2";
              uVar15 = 0x364;
              goto LAB_001badda;
            }
            lVar12 = (long)ntri;
            if (lVar12 != 1) {
              pcVar16 = "edg expects one tri";
              uStackY_220 = 1;
              uVar15 = 0x365;
              goto LAB_001bae14;
            }
            uVar10 = ref_cell_nodes(local_1f0,tri_list[0],tri_nodes);
            if (uVar10 != 0) {
              pcVar16 = "tri nodes";
              uVar15 = 0x367;
              goto LAB_001badda;
            }
            lVar12 = (long)edg_nodes[0];
            pRVar13 = ref_node->real;
            lVar14 = (long)((((tri_nodes[0] - edg_nodes[0]) + tri_nodes[1] + tri_nodes[2]) -
                            edg_nodes[1]) * 0xf);
            local_1e8 = (pRVar13[lVar14 + 1] - pRVar13[lVar12 * 0xf + 1]) * edg_norm[1];
            local_1e0 = (pRVar13[lVar14] - pRVar13[lVar12 * 0xf]) * edg_norm[0];
            dVar19 = (pRVar13[lVar14 + 2] - pRVar13[lVar12 * 0xf + 2]) * edg_norm[2];
            uVar10 = ref_node_next_global(ref_node_00,&global);
            if (uVar10 != 0) {
              pcVar16 = "next";
              uVar15 = 0x372;
              goto LAB_001badda;
            }
            uVar10 = ref_node_add(ref_node_00,CONCAT44(global._4_4_,(REF_INT)global),&new_node);
            if (uVar10 != 0) {
              pcVar16 = "add node";
              uVar15 = 0x373;
              goto LAB_001badda;
            }
            lVar12 = (long)new_node;
            if (uVar8 != new_node) {
              uStackY_220 = (ulong)uVar8;
              pcVar16 = "expects new node to match edg";
              uVar15 = 0x374;
              goto LAB_001bae14;
            }
            dVar19 = dVar19 + local_1e0 + local_1e8;
            if (dVar19 <= -dVar19) {
              dVar19 = -dVar19;
            }
            pRVar13 = ref_node->real;
            pRVar5 = ref_node_00->real;
            for (lVar12 = 0; uVar11 = local_1d8, lVar12 != 3; lVar12 = lVar12 + 1) {
              pRVar5[(local_1d8 & 0xffffffff) + lVar12] =
                   (pRVar13[edg_nodes[0] * 0xf + lVar12] + pRVar13[edg_nodes[1] * 0xf + lVar12]) *
                   0.5 + edg_norm[lVar12] * (dVar19 + dVar19);
            }
          }
          uVar11 = (ulong)((int)uVar11 + 0xf);
        }
        uVar10 = ref_node_synchronize_globals(ref_node_00);
        leading_dim = local_1fc;
        if (uVar10 != 0) {
          pcVar16 = "sync global";
          uVar15 = 0x37d;
LAB_001badda:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar15,"ref_phys_yplus_lengthscale2",(ulong)uVar10,pcVar16);
          return uVar10;
        }
        uVar8 = ref_node_00->max * local_1fc;
        if ((int)uVar8 < 0) {
          pcVar16 = "malloc exchange_field of REF_DBL negative";
          uVar15 = 0x37e;
          goto LAB_001ba9c1;
        }
        pRVar13 = (REF_DBL *)malloc((ulong)uVar8 << 3);
        if (pRVar13 == (REF_DBL *)0x0) {
          pcVar16 = "malloc exchange_field of REF_DBL NULL";
          uVar15 = 0x37e;
          goto LAB_001ba9f6;
        }
        uVar8 = ref_interp_create((REF_INTERP *)edg_nodes,ref_grid,exchange_grid);
        if (uVar8 == 0) {
          uVar8 = ref_interp_locate((REF_INTERP)CONCAT44(edg_nodes[1],edg_nodes[0]));
          if (uVar8 == 0) {
            uVar8 = ref_interp_scalar((REF_INTERP)CONCAT44(edg_nodes[1],edg_nodes[0]),leading_dim,
                                      field,pRVar13);
            if (uVar8 == 0) {
              if (ref_grid->twod == 0) {
                pcVar16 = "implement 3D";
                uVar8 = 6;
                uVar15 = 0x3bd;
              }
              else {
                ref_cell = ref_grid->cell[0];
                local_1f0 = ref_grid->cell[3];
                pRVar17 = (REF_CELL)(pRVar13 + 3);
                for (lVar14 = 0; lVar14 < ref_cell->max; lVar14 = lVar14 + 1) {
                  RVar9 = ref_cell_nodes(ref_cell,(REF_INT)lVar14,edg_nodes);
                  if (RVar9 == 0) {
                    uVar8 = ref_layer_interior_seg_normal(ref_grid,(REF_INT)lVar14,edg_norm);
                    if (uVar8 != 0) {
                      pcVar16 = "edge norm";
                      uVar15 = 0x394;
                      goto LAB_001ba8dc;
                    }
                    uVar8 = ref_cell_list_with2(ref_grid->cell[3],edg_nodes[0],edg_nodes[1],2,
                                                &new_node,(REF_INT *)&global);
                    if (uVar8 != 0) {
                      pcVar16 = "tri with2";
                      uVar15 = 0x397;
                      goto LAB_001ba8dc;
                    }
                    lVar12 = (long)new_node;
                    if (lVar12 != 1) {
                      pcVar16 = "edg expects one tri";
                      uStackY_220 = 1;
                      uVar15 = 0x398;
LAB_001bae14:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,uVar15,"ref_phys_yplus_lengthscale2",pcVar16,uStackY_220,lVar12);
                      return 1;
                    }
                    local_1f8 = pRVar17;
                    uVar8 = ref_cell_nodes(local_1f0,(REF_INT)global,tri_nodes);
                    RVar7 = tri_nodes[1];
                    RVar6 = tri_nodes[0];
                    if (uVar8 != 0) {
                      pcVar16 = "tri nodes";
                      uVar15 = 0x39a;
                      goto LAB_001ba8dc;
                    }
                    uVar11 = (ulong)edg_nodes[0];
                    local_1e8 = (double)CONCAT44(local_1e8._4_4_,tri_nodes[2]);
                    local_1e0 = (double)(long)edg_nodes[1];
                    pRVar5 = ref_node->real;
                    tri_list = (REF_INT  [2])(pRVar5[(long)local_1e0 * 0xf] - pRVar5[uVar11 * 0xf]);
                    dVar19 = pRVar5[(long)local_1e0 * 0xf + 1];
                    dVar20 = pRVar5[uVar11 * 0xf + 1];
                    dVar2 = pRVar5[(long)local_1e0 * 0xf + 2];
                    dVar3 = pRVar5[uVar11 * 0xf + 2];
                    local_1d8 = uVar11;
                    uVar8 = ref_math_normalize((REF_DBL *)tri_list);
                    if (uVar8 != 0) {
                      pcVar16 = "normalize tangent";
                      uVar15 = 0x3a4;
                      goto LAB_001ba8dc;
                    }
                    pRVar5 = ref_node->real;
                    lVar12 = (long)(((RVar7 + local_1e8._0_4_ + (RVar6 - (int)local_1d8)) -
                                    local_1e0._0_4_) * 0xf);
                    dVar19 = 0.0 - (*(double *)local_1f8 * (dVar2 - dVar3) +
                                   (double)local_1f8[-1].c2n * (double)tri_list +
                                   (dVar19 - dVar20) * (double)local_1f8[-1].ref_adj);
                    if (dVar19 <= -dVar19) {
                      dVar19 = -dVar19;
                    }
                    dVar20 = (pRVar5[lVar12 + 2] - pRVar5[uVar11 * 0xf + 2]) * edg_norm[2] +
                             (pRVar5[lVar12] - pRVar5[uVar11 * 0xf]) * edg_norm[0] +
                             (pRVar5[lVar12 + 1] - pRVar5[uVar11 * 0xf + 1]) * edg_norm[1];
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    lVar12 = (long)((int)local_1d8 * local_1fc);
                    uVar8 = ref_phys_yplus_dist(mach,re,reference_t_k,field[lVar12],
                                                (field[lVar12 + 4] / field[lVar12]) * 1.4,
                                                dVar20 + dVar20,dVar19,(REF_DBL *)&ntri);
                    if (uVar8 != 0) {
                      pcVar16 = "yplus dist";
                      uVar15 = 0x3b6;
                      goto LAB_001ba8dc;
                    }
                    lVar12 = (long)edg_nodes[0];
                    lengthscale[lVar12] = lengthscale[lVar12] + (double)CONCAT44(uStack_1cc,ntri);
                    piVar1 = (int *)((long)__ptr + lVar12 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar12 = (long)edg_nodes[1];
                    lengthscale[lVar12] = (double)CONCAT44(uStack_1cc,ntri) + lengthscale[lVar12];
                    piVar1 = (int *)((long)__ptr + lVar12 * 4);
                    *piVar1 = *piVar1 + 1;
                    pRVar17 = local_1f8;
                  }
                  pRVar17 = (REF_CELL)(&pRVar17->type + (long)leading_dim * 2);
                }
                uVar18 = 0;
                uVar11 = (ulong)(uint)ref_node->max;
                if (ref_node->max < 1) {
                  uVar11 = uVar18;
                }
                for (; uVar11 != uVar18; uVar18 = uVar18 + 1) {
                  if ((-1 < ref_node->global[uVar18]) &&
                     (iVar4 = *(int *)((long)__ptr + uVar18 * 4), 0 < iVar4)) {
                    lengthscale[uVar18] = lengthscale[uVar18] / (double)iVar4;
                  }
                }
                free(__ptr);
                uVar8 = ref_node_ghost_dbl(ref_node,lengthscale,1);
                if (uVar8 == 0) {
                  free(pRVar13);
                  uVar8 = ref_grid_free(exchange_grid);
                  if (uVar8 == 0) {
                    return 0;
                  }
                  pcVar16 = "free";
                  uVar15 = 0x3c9;
                }
                else {
                  pcVar16 = "ghost lengthscale";
                  uVar15 = 0x3c6;
                }
              }
            }
            else {
              pcVar16 = "interp scalar";
              uVar15 = 0x385;
            }
          }
          else {
            pcVar16 = "nearest";
            uVar15 = 899;
          }
        }
        else {
          pcVar16 = "make interp";
          uVar15 = 0x382;
        }
      }
      else {
        pcVar16 = "init nnodesg";
        uVar15 = 0x354;
      }
    }
    else {
      pcVar16 = "create exchange";
      uVar15 = 0x34f;
    }
  }
LAB_001ba8dc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar15,
         "ref_phys_yplus_lengthscale2",(ulong)uVar8,pcVar16);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale2(REF_GRID ref_grid, REF_DBL mach,
                                               REF_DBL re,
                                               REF_DBL reference_t_k,
                                               REF_INT ldim, REF_DBL *field,
                                               REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  REF_GRID exchange_grid;
  REF_NODE exchange_node;
  REF_DBL *exchange_field;
  REF_DBL stretch = 2.0;
  if (!ref_grid_twod(ref_grid)) RSS(REF_IMPLEMENT, "implement 3D");

  RSS(ref_grid_create(&exchange_grid, ref_grid_mpi(ref_grid)),
      "create exchange");
  exchange_node = ref_grid_node(exchange_grid);
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);

  RSS(ref_node_initialize_n_global(exchange_node, 0), "init nnodesg");

  {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri, ixyz;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node, new_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    REF_GLOB global;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      RSS(ref_node_next_global(exchange_node, &global), "next");
      RSS(ref_node_add(exchange_node, global, &new_node), "add node");
      REIS(edg, new_node, "expects new node to match edg");
      for (ixyz = 0; ixyz < 3; ixyz++) {
        ref_node_xyz(exchange_node, ixyz, new_node) =
            0.5 * (ref_node_xyz(ref_node, ixyz, edg_nodes[0]) +
                   ref_node_xyz(ref_node, ixyz, edg_nodes[1])) +
            stretch * dn * edg_norm[ixyz];
      }
    }
  }
  RSS(ref_node_synchronize_globals(exchange_node), "sync global");
  ref_malloc(exchange_field, ldim * ref_node_max(exchange_node), REF_DBL);

  {
    REF_INTERP ref_interp;
    RSS(ref_interp_create(&ref_interp, ref_grid, exchange_grid), "make interp");
    RSS(ref_interp_locate(ref_interp), "nearest");
    RSS(ref_interp_scalar(ref_interp, ldim, field, exchange_field),
        "interp scalar");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(exchange_field[1 + ldim * edg]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = stretch * ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  ref_free(exchange_field);
  RSS(ref_grid_free(exchange_grid), "free");

  return REF_SUCCESS;
}